

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O0

ImgProcessor * __thiscall pobr::imgProcessing::ImgProcessor::getBinarizedImg(ImgProcessor *this)

{
  Mat *in_RSI;
  ImgProcessor local_160;
  undefined1 local_f9;
  ImgProcessor local_f8;
  undefined1 local_81;
  ImgProcessor local_80;
  undefined1 local_19;
  ImgProcessor *this_local;
  Mat *img;
  
  this_local = this;
  assertIsReady((ImgProcessor *)in_RSI);
  local_19 = 0;
  cv::Mat::Mat(&this->img,in_RSI);
  local_81 = 0;
  processPreEnhance(&local_80,in_RSI,(bool *)this);
  cv::Mat::operator=(&this->img,&local_80.img);
  cv::Mat::~Mat(&local_80.img);
  local_f9 = 0;
  processBinarize(&local_f8,in_RSI,(bool *)this);
  cv::Mat::operator=(&this->img,&local_f8.img);
  cv::Mat::~Mat(&local_f8.img);
  processBinaryEnhance(&local_160,in_RSI,(bool *)this);
  cv::Mat::operator=(&this->img,&local_160.img);
  cv::Mat::~Mat(&local_160.img);
  return this;
}

Assistant:

const cv::Mat
ImgProcessor::getBinarizedImg()
const
{
    this->assertIsReady();

    auto img = this->img;

    img = this->processPreEnhance(img);
    img = this->processBinarize(img);
    img = this->processBinaryEnhance(img);

    return img;
}